

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O2

void __thiscall QXmlStreamReaderPrivate::resolvePublicNamespaces(QXmlStreamReaderPrivate *this)

{
  long lVar1;
  NamespaceDeclaration *pNVar2;
  qsizetype *pqVar3;
  pointer pQVar4;
  long lVar5;
  long lVar6;
  long in_FS_OFFSET;
  bool bVar7;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pqVar3 = &(this->super_QXmlStreamPrivateTagStack).tagStack.data
            [(this->super_QXmlStreamPrivateTagStack).tagStack.tos].namespaceDeclarationsSize;
  lVar6 = ((this->super_QXmlStreamPrivateTagStack).namespaceDeclarations.tos - *pqVar3) + 1;
  QList<QXmlStreamNamespaceDeclaration>::resize(&this->publicNamespaceDeclarations,lVar6);
  lVar5 = 0;
  if (0 < lVar6) {
    lVar5 = lVar6;
  }
  lVar6 = 0x18;
  while (bVar7 = lVar5 != 0, lVar5 = lVar5 + -1, bVar7) {
    lVar1 = *pqVar3;
    pNVar2 = (this->super_QXmlStreamPrivateTagStack).namespaceDeclarations.data;
    pQVar4 = QList<QXmlStreamNamespaceDeclaration>::data(&this->publicNamespaceDeclarations);
    QtPrivate::XmlStringRef::operator_cast_to_QXmlString
              ((QXmlString *)&local_50,(XmlStringRef *)((long)pNVar2 + lVar6 + lVar1 * 0x30 + -0x18)
              );
    QArrayDataPointer<char16_t>::operator=
              ((QArrayDataPointer<char16_t> *)((long)pQVar4 + lVar6 + -0x18),&local_50);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    QtPrivate::XmlStringRef::operator_cast_to_QXmlString
              ((QXmlString *)&local_50,
               (XmlStringRef *)((long)&pNVar2[lVar1].prefix.m_string + lVar6));
    QArrayDataPointer<char16_t>::operator=
              ((QArrayDataPointer<char16_t> *)((long)&(pQVar4->m_prefix).m_string.d + lVar6),
               &local_50);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    lVar6 = lVar6 + 0x30;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QXmlStreamReaderPrivate::resolvePublicNamespaces()
{
    const Tag &tag = tagStack.top();
    qsizetype n = namespaceDeclarations.size() - tag.namespaceDeclarationsSize;
    publicNamespaceDeclarations.resize(n);
    for (qsizetype i = 0; i < n; ++i) {
        const NamespaceDeclaration &namespaceDeclaration = namespaceDeclarations.at(tag.namespaceDeclarationsSize + i);
        QXmlStreamNamespaceDeclaration &publicNamespaceDeclaration = publicNamespaceDeclarations[i];
        publicNamespaceDeclaration.m_prefix = namespaceDeclaration.prefix;
        publicNamespaceDeclaration.m_namespaceUri = namespaceDeclaration.namespaceUri;
    }
}